

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

char __thiscall Analyser::analyse_expression(Analyser *this)

{
  bool bVar1;
  Token *this_00;
  optional<Token> local_a0;
  undefined4 local_78;
  Instruction local_74;
  Instruction local_64 [2];
  TokenType local_44;
  undefined1 local_40 [4];
  TokenType type;
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  analyse_multiplicative_expression(this);
  nextToken((optional<Token> *)local_40,this);
  do {
    bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
    if (!bVar1) {
LAB_00128c47:
      local_78 = 1;
      std::optional<Token>::~optional((optional<Token> *)local_40);
      return 'i';
    }
    this_00 = std::optional<Token>::value((optional<Token> *)local_40);
    local_44 = Token::GetType(this_00);
    if (local_44 == PLUS_SIGN) {
      analyse_multiplicative_expression(this);
      Instruction::Instruction(local_64,iadd);
      addInstruction(this,local_64);
    }
    else {
      if (local_44 != MINUS_SIGN) {
        unreadToken(this);
        goto LAB_00128c47;
      }
      analyse_multiplicative_expression(this);
      Instruction::Instruction(&local_74,isub);
      addInstruction(this,&local_74);
    }
    nextToken(&local_a0,this);
    std::optional<Token>::operator=((optional<Token> *)local_40,&local_a0);
    std::optional<Token>::~optional(&local_a0);
  } while( true );
}

Assistant:

char Analyser::analyse_expression() {
	analyse_multiplicative_expression();
	auto next = nextToken();

	while (next.has_value()) {
		auto type = next.value().GetType();
		switch (type)
		{
		case TokenType::PLUS_SIGN:
			analyse_multiplicative_expression();
			addInstruction(Instruction(Operation::iadd));
			break;
		case TokenType::MINUS_SIGN:
			analyse_multiplicative_expression();
			addInstruction(Instruction(Operation::isub));
			break;
		default:
			unreadToken();
			return 'i';
		}
		next = nextToken();
	}

	return 'i';
}